

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O3

void __thiscall dlib::drawable_window::on_focus_gained(drawable_window *this)

{
  binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>
  *this_00;
  set_of_drawables *this_01;
  unsigned_long uVar1;
  bool bVar2;
  T *ppdVar3;
  
  this->event_id = this->event_id + 1;
  (this->focus).
  super_set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  .bst.at_start_ = true;
  (this->focus).
  super_set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  .bst.stack_pos = '\0';
  (this->focus).
  super_set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  .bst.current_element = (node *)0x0;
  this_00 = &(this->focus).
             super_set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
             .bst;
  bVar2 = binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>
          ::move_next(this_00);
  if (bVar2) {
    this_01 = &this->focus;
    do {
      ppdVar3 = set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
                ::element(this_01);
      uVar1 = this->event_id;
      if ((*ppdVar3)->event_id != uVar1) {
        ppdVar3 = set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
                  ::element(this_01);
        (*ppdVar3)->event_id = uVar1;
        ppdVar3 = set_kernel_c<dlib::set_kernel_1<dlib::drawable_*,_dlib::binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
                  ::element(this_01);
        (*(*ppdVar3)->_vptr_drawable[0x15])();
      }
      bVar2 = binary_search_tree_kernel_1<dlib::drawable_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::drawable_*>_>
              ::move_next(this_00);
    } while (bVar2);
  }
  return;
}

Assistant:

void drawable_window::
    on_focus_gained (
    )
    {
        ++event_id;
        focus.reset();
        while (focus.move_next())
        {
            if (focus.element()->event_id != event_id)
            {
                focus.element()->event_id = event_id;
                focus.element()->on_focus_gained();
            }
        }
    }